

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFrustumTest.h
# Opt level: O3

void __thiscall
Imath_3_2::FrustumTest<float>::setFrustum
          (FrustumTest<float> *this,Frustum<float> *frustum,Matrix44<float> *cameraMat)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  long lVar13;
  Plane3<float> frustumPlanes [6];
  Plane3<float> local_78;
  float afStack_68 [20];
  
  Frustum<float>::planes(frustum,&local_78,cameraMat);
  lVar13 = 0;
  bVar11 = true;
  do {
    bVar12 = bVar11;
    fVar1 = (&local_78)[lVar13 * 3].normal.x;
    fVar2 = afStack_68[lVar13 * 0xc];
    fVar3 = afStack_68[lVar13 * 0xc + 4];
    this->planeNormX[lVar13].x = fVar1;
    this->planeNormX[lVar13].y = fVar2;
    this->planeNormX[lVar13].z = fVar3;
    fVar4 = afStack_68[lVar13 * 0xc + -3];
    fVar5 = afStack_68[lVar13 * 0xc + 1];
    fVar6 = afStack_68[lVar13 * 0xc + 5];
    this->planeNormY[lVar13].x = fVar4;
    this->planeNormY[lVar13].y = fVar5;
    this->planeNormY[lVar13].z = fVar6;
    fVar7 = afStack_68[lVar13 * 0xc + -2];
    fVar8 = afStack_68[lVar13 * 0xc + 2];
    fVar9 = afStack_68[lVar13 * 0xc + 6];
    this->planeNormZ[lVar13].x = fVar7;
    this->planeNormZ[lVar13].y = fVar8;
    this->planeNormZ[lVar13].z = fVar9;
    uVar10 = CONCAT44(fVar2,fVar1) & 0x7fffffff7fffffff;
    this->planeNormAbsX[lVar13].x = (float)(int)uVar10;
    this->planeNormAbsX[lVar13].y = (float)(int)(uVar10 >> 0x20);
    this->planeNormAbsX[lVar13].z = ABS(fVar3);
    uVar10 = CONCAT44(fVar5,fVar4) & 0x7fffffff7fffffff;
    this->planeNormAbsY[lVar13].x = (float)(int)uVar10;
    this->planeNormAbsY[lVar13].y = (float)(int)(uVar10 >> 0x20);
    this->planeNormAbsY[lVar13].z = ABS(fVar6);
    uVar10 = CONCAT44(fVar8,fVar7) & 0x7fffffff7fffffff;
    this->planeNormAbsZ[lVar13].x = (float)(int)uVar10;
    this->planeNormAbsZ[lVar13].y = (float)(int)(uVar10 >> 0x20);
    this->planeNormAbsZ[lVar13].z = ABS(fVar9);
    fVar1 = afStack_68[lVar13 * 0xc + 3];
    fVar2 = afStack_68[lVar13 * 0xc + 7];
    this->planeOffsetVec[lVar13].x = afStack_68[lVar13 * 0xc + -1];
    this->planeOffsetVec[lVar13].y = fVar1;
    this->planeOffsetVec[lVar13].z = fVar2;
    lVar13 = 1;
    bVar11 = false;
  } while (bVar12);
  fVar1 = frustum->_farPlane;
  fVar2 = frustum->_left;
  fVar3 = frustum->_right;
  (this->currFrustum)._nearPlane = frustum->_nearPlane;
  (this->currFrustum)._farPlane = fVar1;
  (this->currFrustum)._left = fVar2;
  (this->currFrustum)._right = fVar3;
  fVar1 = frustum->_bottom;
  (this->currFrustum)._top = frustum->_top;
  (this->currFrustum)._bottom = fVar1;
  (this->currFrustum)._orthographic = frustum->_orthographic;
  (this->cameraMatrix).x[0][0] = cameraMat->x[0][0];
  (this->cameraMatrix).x[0][1] = cameraMat->x[0][1];
  (this->cameraMatrix).x[0][2] = cameraMat->x[0][2];
  (this->cameraMatrix).x[0][3] = cameraMat->x[0][3];
  (this->cameraMatrix).x[1][0] = cameraMat->x[1][0];
  (this->cameraMatrix).x[1][1] = cameraMat->x[1][1];
  (this->cameraMatrix).x[1][2] = cameraMat->x[1][2];
  (this->cameraMatrix).x[1][3] = cameraMat->x[1][3];
  (this->cameraMatrix).x[2][0] = cameraMat->x[2][0];
  (this->cameraMatrix).x[2][1] = cameraMat->x[2][1];
  (this->cameraMatrix).x[2][2] = cameraMat->x[2][2];
  (this->cameraMatrix).x[2][3] = cameraMat->x[2][3];
  (this->cameraMatrix).x[3][0] = cameraMat->x[3][0];
  (this->cameraMatrix).x[3][1] = cameraMat->x[3][1];
  (this->cameraMatrix).x[3][2] = cameraMat->x[3][2];
  (this->cameraMatrix).x[3][3] = cameraMat->x[3][3];
  return;
}

Assistant:

void
FrustumTest<T>::setFrustum (
    const Frustum<T>& frustum, const Matrix44<T>& cameraMat) IMATH_NOEXCEPT
{
    Plane3<T> frustumPlanes[6];
    frustum.planes (frustumPlanes, cameraMat);

    // Here's where we effectively transpose the plane equations.
    // We stuff all six X's into the two planeNormX vectors, etc.
    for (int i = 0; i < 2; ++i)
    {
        int index = i * 3;

        planeNormX[i] = Vec3<T> (
            frustumPlanes[index + 0].normal.x,
            frustumPlanes[index + 1].normal.x,
            frustumPlanes[index + 2].normal.x);
        planeNormY[i] = Vec3<T> (
            frustumPlanes[index + 0].normal.y,
            frustumPlanes[index + 1].normal.y,
            frustumPlanes[index + 2].normal.y);
        planeNormZ[i] = Vec3<T> (
            frustumPlanes[index + 0].normal.z,
            frustumPlanes[index + 1].normal.z,
            frustumPlanes[index + 2].normal.z);

        planeNormAbsX[i] = Vec3<T> (
            std::abs (planeNormX[i].x),
            std::abs (planeNormX[i].y),
            std::abs (planeNormX[i].z));
        planeNormAbsY[i] = Vec3<T> (
            std::abs (planeNormY[i].x),
            std::abs (planeNormY[i].y),
            std::abs (planeNormY[i].z));
        planeNormAbsZ[i] = Vec3<T> (
            std::abs (planeNormZ[i].x),
            std::abs (planeNormZ[i].y),
            std::abs (planeNormZ[i].z));

        planeOffsetVec[i] = Vec3<T> (
            frustumPlanes[index + 0].distance,
            frustumPlanes[index + 1].distance,
            frustumPlanes[index + 2].distance);
    }
    currFrustum  = frustum;
    cameraMatrix = cameraMat;
}